

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O0

bool __thiscall Arbitraryforward_list::Run(Arbitraryforward_list *this)

{
  pointer *this_00;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  bool local_99;
  _Self local_90;
  _Self local_88;
  iterator it_2;
  _Self local_78;
  iterator it_1;
  size_t vv1len;
  size_t vv0len;
  _Self local_58;
  iterator it;
  size_t vlen;
  undefined1 local_38 [8];
  vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
  vv;
  forward_list<int,_std::allocator<int>_> v;
  Arbitrary<std::forward_list<int,_std::allocator<int>_>_> a;
  Arbitraryforward_list *this_local;
  
  this_00 = &vv.
             super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  testinator::Arbitrary<std::forward_list<int,_std::allocator<int>_>_>::generate
            ((Arbitrary<std::forward_list<int,_std::allocator<int>_>_> *)this_00,1,0);
  testinator::Arbitrary<std::forward_list<int,_std::allocator<int>_>_>::shrink
            ((vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
              *)local_38,(output_type *)this_00);
  it._M_node = (_Fwd_list_node_base *)0x0;
  local_58._M_node =
       (_Fwd_list_node_base *)
       std::forward_list<int,_std::allocator<int>_>::begin
                 ((forward_list<int,_std::allocator<int>_> *)
                  &vv.
                   super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    vv0len = (size_t)std::forward_list<int,_std::allocator<int>_>::end
                               ((forward_list<int,_std::allocator<int>_> *)
                                &vv.
                                 super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = std::operator!=(&local_58,(_Self *)&vv0len);
    if (!bVar1) break;
    std::_Fwd_list_iterator<int>::operator++(&local_58);
    it._M_node = (_Fwd_list_node_base *)((long)&(it._M_node)->_M_next + 1);
  }
  vv1len = 0;
  it_1._M_node = (_Fwd_list_node_base *)0x0;
  sVar2 = std::
          vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
          ::size((vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
                  *)local_38);
  if (sVar2 != 0) {
    pvVar3 = std::
             vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
                           *)local_38,0);
    local_78._M_node =
         (_Fwd_list_node_base *)std::forward_list<int,_std::allocator<int>_>::begin(pvVar3);
    while( true ) {
      pvVar3 = std::
               vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
                             *)local_38,0);
      it_2 = std::forward_list<int,_std::allocator<int>_>::end(pvVar3);
      bVar1 = std::operator!=(&local_78,&it_2);
      if (!bVar1) break;
      std::_Fwd_list_iterator<int>::operator++(&local_78);
      vv1len = vv1len + 1;
    }
  }
  sVar2 = std::
          vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
          ::size((vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
                  *)local_38);
  if (1 < sVar2) {
    pvVar3 = std::
             vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
                           *)local_38,1);
    local_88._M_node =
         (_Fwd_list_node_base *)std::forward_list<int,_std::allocator<int>_>::begin(pvVar3);
    while( true ) {
      pvVar3 = std::
               vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
                             *)local_38,1);
      local_90._M_node =
           (_Fwd_list_node_base *)std::forward_list<int,_std::allocator<int>_>::end(pvVar3);
      bVar1 = std::operator!=(&local_88,&local_90);
      if (!bVar1) break;
      std::_Fwd_list_iterator<int>::operator++(&local_88);
      it_1._M_node = (_Fwd_list_node_base *)((long)&(it_1._M_node)->_M_next + 1);
    }
  }
  sVar2 = std::
          vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
          ::size((vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
                  *)local_38);
  local_99 = sVar2 == 2 &&
             (_Fwd_list_node_base *)((long)&(it_1._M_node)->_M_next + vv1len) == it._M_node;
  std::
  vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
             *)local_38);
  std::forward_list<int,_std::allocator<int>_>::~forward_list
            ((forward_list<int,_std::allocator<int>_> *)
             &vv.
              super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return local_99;
}

Assistant:

DEF_TEST(forward_list, Arbitrary)
{
  testinator::Arbitrary<forward_list<int>> a;
  forward_list<int> v = a.generate(1,0);
  vector<forward_list<int>> vv = a.shrink(v);

  std::size_t vlen = 0;
  for (auto it = v.begin(); it != v.end(); ++it, ++vlen);

  std::size_t vv0len = 0;
  std::size_t vv1len = 0;
  if (vv.size() > 0)
    for (auto it = vv[0].begin(); it != vv[0].end(); ++it, ++vv0len);
  if (vv.size() > 1)
    for (auto it = vv[1].begin(); it != vv[1].end(); ++it, ++vv1len);

  return vv.size() == 2
    && vv0len + vv1len == vlen;
}